

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int checkColumnOverlap(IdList *pIdList,ExprList *pEList)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (pEList == (ExprList *)0x0 || pIdList == (IdList *)0x0) {
    return 1;
  }
  if ((long)pEList->nExpr < 1) {
    return 0;
  }
  lVar4 = 0;
  while (pIdList->nId < 1) {
LAB_001a4022:
    lVar4 = lVar4 + 1;
    if (lVar4 == pEList->nExpr) {
      return 0;
    }
  }
  uVar5 = 0;
LAB_001a3fee:
  lVar3 = 0;
  do {
    bVar1 = pIdList->a[uVar5].zName[lVar3];
    bVar2 = pEList->a[lVar4].zEName[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) {
        return 1;
      }
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  uVar5 = uVar5 + 1;
  if (uVar5 == (uint)pIdList->nId) goto LAB_001a4022;
  goto LAB_001a3fee;
}

Assistant:

static int checkColumnOverlap(IdList *pIdList, ExprList *pEList){
  int e;
  if( pIdList==0 || NEVER(pEList==0) ) return 1;
  for(e=0; e<pEList->nExpr; e++){
    if( sqlite3IdListIndex(pIdList, pEList->a[e].zEName)>=0 ) return 1;
  }
  return 0;
}